

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean dump_buffer_s(working_state *state)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *in_RDI;
  jpeg_destination_mgr *dest;
  uint local_4;
  
  puVar1 = *(undefined8 **)(in_RDI[6] + 0x28);
  iVar2 = (*(code *)puVar1[3])(in_RDI[6]);
  if (iVar2 != 0) {
    *in_RDI = *puVar1;
    in_RDI[1] = puVar1[1];
  }
  local_4 = (uint)(iVar2 != 0);
  return local_4;
}

Assistant:

LOCAL(boolean)
dump_buffer_s (working_state * state)
/* Empty the output buffer; return TRUE if successful, FALSE if must suspend */
{
  struct jpeg_destination_mgr * dest = state->cinfo->dest;

  if (! (*dest->empty_output_buffer) (state->cinfo))
    return FALSE;
  /* After a successful buffer dump, must reset buffer pointers */
  state->next_output_byte = dest->next_output_byte;
  state->free_in_buffer = dest->free_in_buffer;
  return TRUE;
}